

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

int send_flow(LINK_INSTANCE *link)

{
  int iVar1;
  int extraout_EAX;
  FLOW_HANDLE flow;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  
  flow = flow_create(0,0,0);
  if (flow == (FLOW_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                         ,"send_flow",0x7b,1,"NULL flow performative");
      return iVar1;
    }
    return 0;
  }
  iVar1 = flow_set_link_credit(flow,link->current_link_credit);
  if (iVar1 == 0) {
    iVar1 = flow_set_handle(flow,link->handle);
    if (iVar1 == 0) {
      iVar1 = flow_set_delivery_count(flow,link->delivery_count);
      if (iVar1 == 0) {
        iVar1 = session_send_flow(link->link_endpoint,flow);
        if (iVar1 == 0) goto LAB_001678eb;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_001678eb;
        pcVar2 = "Sending flow frame failed in session send";
        iVar1 = 0x93;
      }
      else {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_001678eb;
        pcVar2 = "Cannot set delivery count on flow performative";
        iVar1 = 0x8c;
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_001678eb;
      pcVar2 = "Cannot set handle on flow performative";
      iVar1 = 0x87;
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_001678eb;
    pcVar2 = "Cannot set link credit on flow performative";
    iVar1 = 0x82;
  }
  (*UNRECOVERED_JUMPTABLE)
            (AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
             ,"send_flow",iVar1,1,pcVar2);
LAB_001678eb:
  flow_destroy(flow);
  return extraout_EAX;
}

Assistant:

static int send_flow(LINK_INSTANCE* link)
{
    int result;
    FLOW_HANDLE flow = flow_create(0, 0, 0);

    if (flow == NULL)
    {
        LogError("NULL flow performative");
        result = MU_FAILURE;
    }
    else
    {
        if (flow_set_link_credit(flow, link->current_link_credit) != 0)
        {
            LogError("Cannot set link credit on flow performative");
            result = MU_FAILURE;
        }
        else if (flow_set_handle(flow, link->handle) != 0)
        {
            LogError("Cannot set handle on flow performative");
            result = MU_FAILURE;
        }
        else if (flow_set_delivery_count(flow, link->delivery_count) != 0)
        {
            LogError("Cannot set delivery count on flow performative");
            result = MU_FAILURE;
        }
        else
        {
            if (session_send_flow(link->link_endpoint, flow) != 0)
            {
                LogError("Sending flow frame failed in session send");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }

        flow_destroy(flow);
    }

    return result;
}